

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnu_gettext.h
# Opt level: O3

void __thiscall booster::locale::gnu_gettext::messages_info::messages_info(messages_info *this)

{
  (this->language)._M_dataplus._M_p = (pointer)&(this->language).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"C","");
  (this->country)._M_dataplus._M_p = (pointer)&(this->country).field_2;
  (this->country)._M_string_length = 0;
  (this->country).field_2._M_local_buf[0] = '\0';
  (this->variant)._M_dataplus._M_p = (pointer)&(this->variant).field_2;
  (this->variant)._M_string_length = 0;
  (this->variant).field_2._M_local_buf[0] = '\0';
  (this->encoding)._M_dataplus._M_p = (pointer)&(this->encoding).field_2;
  (this->encoding)._M_string_length = 0;
  (this->encoding).field_2._M_local_buf[0] = '\0';
  (this->locale_category)._M_dataplus._M_p = (pointer)&(this->locale_category).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->locale_category,"LC_MESSAGES","")
  ;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->domains).
  super__Vector_base<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->paths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->domains).
  super__Vector_base<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->domains).
  super__Vector_base<booster::locale::gnu_gettext::messages_info::domain,_std::allocator<booster::locale::gnu_gettext::messages_info::domain>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

messages_info() :
            language("C"),
            locale_category("LC_MESSAGES")
        {
        }